

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O0

aspa_status
aspa_table_update_compute_internal
          (rtr_socket *rtr_socket,aspa_array *array,aspa_array *new_array,
          aspa_update_operation *operations,size_t count,aspa_update_operation **failed_operation)

{
  long lVar1;
  aspa_status aVar2;
  aspa_update_operation *paVar3;
  aspa_record *paVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  aspa_update_operation *local_88;
  _Bool next_matches_current;
  _Bool existing_matches_current;
  aspa_record *existing_record;
  aspa_record *existing_record_1;
  aspa_update_operation *next;
  aspa_update_operation *current;
  size_t i;
  size_t existing_i;
  aspa_update_operation **failed_operation_local;
  size_t count_local;
  aspa_update_operation *operations_local;
  aspa_array *new_array_local;
  aspa_array *array_local;
  rtr_socket *rtr_socket_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x11b,
                  "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (array == (aspa_array *)0x0) {
    __assert_fail("array",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x11c,
                  "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (operations == (aspa_update_operation *)0x0) {
    __assert_fail("operations",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x11d,
                  "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (count == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x11e,
                  "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  if (failed_operation == (aspa_update_operation **)0x0) {
    __assert_fail("failed_operation",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x11f,
                  "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                 );
  }
  i = 0;
  aspa_array_reserve(new_array,array->size + count);
  current = (aspa_update_operation *)0x0;
  do {
    if (count <= current) {
      for (; i < array->size; i = i + 1) {
        paVar4 = aspa_array_get_record(array,i);
        aspa_array_append(new_array,paVar4,false);
      }
      rtr_socket_local._4_4_ = ASPA_SUCCESS;
LAB_001131e8:
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
        __stack_chk_fail();
      }
      return rtr_socket_local._4_4_;
    }
    paVar3 = operations + (long)current;
    if (current < (aspa_update_operation *)(count - 1)) {
      local_88 = operations + (long)((long)&current->index + 1);
    }
    else {
      local_88 = (aspa_update_operation *)0x0;
    }
    if (paVar3->type == ASPA_REMOVE) {
      if ((paVar3->record).provider_count != 0) {
        __assert_fail("current->record.provider_count == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x12d,
                      "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                     );
      }
      if ((paVar3->record).provider_asns != (uint32_t *)0x0) {
        __assert_fail("!current->record.provider_asns",
                      "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                      ,0x12e,
                      "enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *, struct aspa_array *, struct aspa_array *, struct aspa_update_operation *, size_t, struct aspa_update_operation **)"
                     );
      }
    }
    if (((paVar3->record).provider_count != 0) &&
       ((paVar3->record).provider_asns != (uint32_t *)0x0)) {
      qsort((paVar3->record).provider_asns,(paVar3->record).provider_count,4,compare_asns);
    }
    while ((i < array->size &&
           (paVar4 = aspa_array_get_record(array,i),
           paVar4->customer_asn < (paVar3->record).customer_asn))) {
      i = i + 1;
      aVar2 = aspa_array_append(new_array,paVar4,false);
      if (aVar2 != ASPA_SUCCESS) {
        *failed_operation = paVar3;
        rtr_socket_local._4_4_ = ASPA_ERROR;
        goto LAB_001131e8;
      }
    }
    paVar4 = aspa_array_get_record(array,i);
    bVar5 = false;
    if (paVar4 != (aspa_record *)0x0) {
      bVar5 = paVar4->customer_asn == (paVar3->record).customer_asn;
    }
    bVar6 = false;
    if (local_88 != (aspa_update_operation *)0x0) {
      bVar6 = (local_88->record).customer_asn == (paVar3->record).customer_asn;
    }
    if (paVar3->type == ASPA_ADD) {
      if (bVar5) {
        *failed_operation = paVar3;
        rtr_socket_local._4_4_ = ASPA_DUPLICATE_RECORD;
        goto LAB_001131e8;
      }
      if ((bVar6) && (local_88->type == ASPA_ADD)) {
        *failed_operation = local_88;
        (paVar3->record).provider_asns = (uint32_t *)0x0;
        rtr_socket_local._4_4_ = ASPA_DUPLICATE_RECORD;
        goto LAB_001131e8;
      }
      if ((bVar6) && (local_88->type == ASPA_REMOVE)) {
        paVar3->is_no_op = true;
        local_88->is_no_op = true;
        current = (aspa_update_operation *)((long)&current->index + 1);
      }
      else {
        aVar2 = aspa_array_append(new_array,&paVar3->record,true);
        if (aVar2 != ASPA_SUCCESS) {
          *failed_operation = paVar3;
          rtr_socket_local._4_4_ = ASPA_ERROR;
          goto LAB_001131e8;
        }
        paVar4 = aspa_array_get_record(new_array,(ulong)(new_array->size - 1));
        (paVar3->record).provider_asns = paVar4->provider_asns;
      }
    }
    else if (paVar3->type == ASPA_REMOVE) {
      if (!bVar5) {
        *failed_operation = paVar3;
        rtr_socket_local._4_4_ = ASPA_RECORD_NOT_FOUND;
        goto LAB_001131e8;
      }
      if ((bVar6) && (local_88->type == ASPA_REMOVE)) {
        *failed_operation = local_88;
        rtr_socket_local._4_4_ = ASPA_RECORD_NOT_FOUND;
        goto LAB_001131e8;
      }
      i = i + 1;
      (paVar3->record).provider_count = paVar4->provider_count;
      (paVar3->record).provider_asns = paVar4->provider_asns;
    }
    current = (aspa_update_operation *)((long)&current->index + 1);
  } while( true );
}

Assistant:

static enum aspa_status aspa_table_update_compute_internal(struct rtr_socket *rtr_socket, struct aspa_array *array,
							   struct aspa_array *new_array,
							   struct aspa_update_operation *operations, size_t count,
							   struct aspa_update_operation **failed_operation)
{
	// Fail hard in debug builds.
	assert(rtr_socket);
	assert(array);
	assert(operations);
	assert(count > 0);
	assert(failed_operation);

	size_t existing_i = 0;

	// preemptively allocate space for the arrays
	aspa_array_reserve(new_array, array->size + count);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *current = &operations[i];
		struct aspa_update_operation *next = (i < count - 1) ? &(operations[i + 1]) : NULL;

#ifndef NDEBUG
		// Sanity check record
		if (current->type == ASPA_REMOVE) {
			assert(current->record.provider_count == 0);
			assert(!current->record.provider_asns);
		}
#endif

		// Sort providers.
		// We consider this an implementation detail, callers must not make any assumptions on the
		// ordering of provider ASNs.
		if (current->record.provider_count > 0 && current->record.provider_asns)
			qsort(current->record.provider_asns, current->record.provider_count, sizeof(uint32_t),
			      compare_asns);

		while (existing_i < array->size) {
			struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

			// Skip over records untouched by these add/remove operations
			if (existing_record->customer_asn < current->record.customer_asn) {
				existing_i += 1;

				// Append existing record (reuse existing provider array)
				if (aspa_array_append(new_array, existing_record, false) != ASPA_SUCCESS) {
					*failed_operation = current;
					return ASPA_ERROR;
				}
			} else {
				break;
			}
		}

		struct aspa_record *existing_record = aspa_array_get_record(array, existing_i);

		// existing record and current op have matching CAS
		bool existing_matches_current = existing_record &&
						existing_record->customer_asn == current->record.customer_asn;

		// next record and current op have matching CAS
		bool next_matches_current = next && next->record.customer_asn == current->record.customer_asn;

		// MARK: Handling 'add' operations
		if (current->type == ASPA_ADD) {
			// Attempt to add record with $CAS, but record with $CAS already exists
			// Error: Duplicate Add.
			if (existing_matches_current) {
				*failed_operation = current;
				return ASPA_DUPLICATE_RECORD;
			}

			// Attempt to add record with $CAS twice.
			// Error: Duplicate Add.
			if (next_matches_current && next->type == ASPA_ADD) {
				*failed_operation = next;
				current->record.provider_asns = NULL;
				return ASPA_DUPLICATE_RECORD;
			}

			// This operation adds a record with $CAS, the next op however removes this $CAS record again.
			// These form a no-op.
			if (next_matches_current && next->type == ASPA_REMOVE) {
#if ASPA_NOTIFY_NO_OPS
				// Complete record's providers for clients
				next->record = current->record;
#endif

				// Mark as no-op.
				current->is_no_op = true;
				next->is_no_op = true;

				// Skip next
				i += 1;
				continue;
			}

			// Add record by appending it to new array (copy providers)
			if (aspa_array_append(new_array, &current->record, true) != ASPA_SUCCESS) {
				*failed_operation = current;
				return ASPA_ERROR;
			}

			// If it's an add operation, we insert a reference to the newly created record's providers.
			current->record.provider_asns =
				aspa_array_get_record(new_array, new_array->size - 1)->provider_asns;
		}

		// MARK: Handling 'remove' operations
		else if (current->type == ASPA_REMOVE) {
			// Attempt to remove record with $CAS, but record with $CAS does not exist
			// Error: Removal of unknown record.
			if (!existing_matches_current) {
				*failed_operation = current;
				return ASPA_RECORD_NOT_FOUND;
			}

			// Attempt to remove record with $CAS twice.
			// Error: Removal of unknown record.
			if (next_matches_current && next->type == ASPA_REMOVE) {
				*failed_operation = next;
				return ASPA_RECORD_NOT_FOUND;
			}

			// "Remove" record by simply not appending it to the new array
			existing_i += 1;

			// If it's a remove operation, we insert a reference to the removed record's providers.
			current->record.provider_count = existing_record->provider_count;
			current->record.provider_asns = existing_record->provider_asns;
		}
	}

	// Append remaining records (reuse existing provider array)
	for (; existing_i < array->size; existing_i++)
		aspa_array_append(new_array, aspa_array_get_record(array, existing_i), false);

	return ASPA_SUCCESS;
}